

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

int read_setting_i(settings_r *handle,char *key,int defvalue)

{
  int iVar1;
  void *pvVar2;
  char *__nptr;
  skeyval tmp;
  char *local_20 [2];
  
  local_20[0] = key;
  if ((handle == (settings_r *)0x0) ||
     (pvVar2 = find234(handle->t,local_20,(cmpfn234)0x0), pvVar2 == (void *)0x0)) {
    __nptr = get_setting(key);
    if (__nptr == (char *)0x0) {
      return defvalue;
    }
  }
  else {
    __nptr = *(char **)((long)pvVar2 + 8);
    if (__nptr == (char *)0x0) {
      __assert_fail("val != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/storage.c"
                    ,0x1bd,"int read_setting_i(settings_r *, const char *, int)");
    }
  }
  iVar1 = atoi(__nptr);
  return iVar1;
}

Assistant:

int read_setting_i(settings_r *handle, const char *key, int defvalue)
{
    const char *val;
    struct skeyval tmp, *kv;

    tmp.key = key;
    if (handle != NULL &&
        (kv = find234(handle->t, &tmp, NULL)) != NULL) {
        val = kv->value;
        assert(val != NULL);
    } else
        val = get_setting(key);

    if (!val)
        return defvalue;
    else
        return atoi(val);
}